

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qglibnetworkinformationbackend.cpp
# Opt level: O3

QLoggingCategory * lcNetInfoGlib(void)

{
  if (lcNetInfoGlib()::category == '\0') {
    lcNetInfoGlib();
  }
  return &lcNetInfoGlib::category;
}

Assistant:

QNetworkInformation::Reachability reachabilityFromGNetworkConnectivity(GNetworkConnectivity connectivity)
{
    switch (connectivity) {
    case G_NETWORK_CONNECTIVITY_LOCAL:
        return QNetworkInformation::Reachability::Disconnected;
    case G_NETWORK_CONNECTIVITY_LIMITED:
    case G_NETWORK_CONNECTIVITY_PORTAL:
        return QNetworkInformation::Reachability::Site;
    case G_NETWORK_CONNECTIVITY_FULL:
        return QNetworkInformation::Reachability::Online;
    }
    return QNetworkInformation::Reachability::Unknown;
}